

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

void __thiscall slang::ast::DriverVisitor::handle(DriverVisitor *this,ValueExpressionBase *expr)

{
  undefined1 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  ValueSymbol *this_00;
  SubroutineSymbol *pSVar5;
  Scope *pSVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  Symbol *pSVar9;
  bool bVar10;
  ulong pos0;
  ulong uVar11;
  Scope *pSVar12;
  ValueSymbol *pVVar13;
  ulong hash;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 auVar22 [16];
  SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
  drivers;
  const_iterator it;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  range;
  ValueSymbol *local_190;
  long local_188;
  undefined8 local_180;
  undefined1 local_148;
  undefined1 uStack_147;
  undefined1 uStack_146;
  undefined1 uStack_145;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined1 uStack_142;
  undefined1 uStack_141;
  undefined1 uStack_140;
  undefined1 uStack_13f;
  undefined1 uStack_13e;
  undefined1 uStack_13d;
  undefined1 uStack_13c;
  undefined1 uStack_13b;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  undefined1 local_138 [16];
  anon_union_8_2_f12d5f64_for_typeOrLink local_128;
  undefined1 local_118 [48];
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> local_e8;
  undefined1 local_b0 [128];
  
  this_00 = expr->symbol;
  puVar1 = &(this->visitedValues).super_Storage.field_0x48;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this_00;
  hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((this->visitedValues).field_0x50 & 0x3f);
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  uVar11 = *(ulong *)&(this->visitedValues).field_0x58;
  uVar14 = 0;
  uVar17 = pos0;
  do {
    pcVar2 = (char *)(*(long *)&(this->visitedValues).field_0x60 + uVar17 * 0x10);
    local_148 = *pcVar2;
    uStack_147 = pcVar2[1];
    uStack_146 = pcVar2[2];
    uStack_145 = pcVar2[3];
    uStack_144 = pcVar2[4];
    uStack_143 = pcVar2[5];
    uStack_142 = pcVar2[6];
    uStack_141 = pcVar2[7];
    uStack_140 = pcVar2[8];
    uStack_13f = pcVar2[9];
    uStack_13e = pcVar2[10];
    uStack_13d = pcVar2[0xb];
    uStack_13c = pcVar2[0xc];
    uStack_13b = pcVar2[0xd];
    uStack_13a = pcVar2[0xe];
    uStack_139 = pcVar2[0xf];
    uVar18 = (undefined1)uVar4;
    auVar22[0] = -(local_148 == uVar18);
    uVar19 = (undefined1)((uint)uVar4 >> 8);
    auVar22[1] = -(uStack_147 == uVar19);
    uVar20 = (undefined1)((uint)uVar4 >> 0x10);
    auVar22[2] = -(uStack_146 == uVar20);
    uVar21 = (undefined1)((uint)uVar4 >> 0x18);
    auVar22[3] = -(uStack_145 == uVar21);
    auVar22[4] = -(uStack_144 == uVar18);
    auVar22[5] = -(uStack_143 == uVar19);
    auVar22[6] = -(uStack_142 == uVar20);
    auVar22[7] = -(uStack_141 == uVar21);
    auVar22[8] = -(uStack_140 == uVar18);
    auVar22[9] = -(uStack_13f == uVar19);
    auVar22[10] = -(uStack_13e == uVar20);
    auVar22[0xb] = -(uStack_13d == uVar21);
    auVar22[0xc] = -(uStack_13c == uVar18);
    auVar22[0xd] = -(uStack_13b == uVar19);
    auVar22[0xe] = -(uStack_13a == uVar20);
    auVar22[0xf] = -(uStack_139 == uVar21);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      do {
        uVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        if (this_00 ==
            *(ValueSymbol **)
             (*(long *)&(this->visitedValues).field_0x68 + uVar17 * 0x78 + (ulong)uVar7 * 8)) {
          return;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & uStack_139) == 0) break;
    lVar16 = uVar17 + uVar14;
    uVar14 = uVar14 + 1;
    uVar17 = lVar16 + 1U & uVar11;
  } while (uVar14 <= uVar11);
  local_190 = this_00;
  if (*(ulong *)&(this->visitedValues).field_0x78 < *(ulong *)&(this->visitedValues).field_0x70) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
    ::nosize_unchecked_emplace_at<slang::ast::ValueSymbol_const*>
              ((locator *)local_b0,
               (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                *)puVar1,(arrays_type *)&(this->visitedValues).field_0x50,pos0,hash,&local_190);
    puVar1 = &(this->visitedValues).field_0x78;
    *(long *)puVar1 = *(long *)puVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
    ::unchecked_emplace_with_rehash<slang::ast::ValueSymbol_const*>
              ((locator *)local_b0,
               (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                *)puVar1,hash,&local_190);
  }
  pSVar5 = this->sub;
  if (((((pSVar5->super_Scope).compilation)->options).flags.m_bits & 0x1000) != 0) {
    pSVar12 = &pSVar5->super_Scope;
    pVVar13 = this_00;
    do {
      pSVar6 = (pVVar13->super_Symbol).parentScope;
      if (pSVar6 == (Scope *)0x0) break;
      pVVar13 = (ValueSymbol *)pSVar6->thisSym;
    } while ((pVVar13->super_Symbol).kind == StatementBlock);
    if (pSVar5 == (SubroutineSymbol *)0x0) {
      pSVar12 = (Scope *)0x0;
    }
    if (pSVar6 == pSVar12) {
      return;
    }
  }
  local_190 = (ValueSymbol *)&stack0xfffffffffffffe88;
  local_188 = 0;
  local_180 = 2;
  ValueSymbol::drivers
            ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
              *)local_b0,this_00);
  local_118._40_8_ = local_b0._0_8_;
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
            (&local_e8,(Base *)(local_b0 + 8));
  while( true ) {
    local_138._0_8_ = local_b0._64_8_;
    SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
              ((SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *)(local_138 + 8),
               (Base *)(local_b0 + 0x48));
    bVar10 = IntervalMapDetails::Path::operator==((Path *)&local_e8,(Path *)(local_138 + 8));
    if ((Type *)local_138._8_8_ != (Type *)local_118) {
      operator_delete((void *)local_138._8_8_);
    }
    if (bVar10) break;
    uVar11 = (ulong)*(uint *)((undefined1 *)
                              ((long)local_e8.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     data_ - 4) +
                             local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                             len * 0x10);
    lVar16 = *(long *)((undefined1 *)
                       ((long)local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                              .data_ - 0x10) +
                      local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len *
                      0x10);
    if (*(SubroutineSymbol **)(*(long *)(lVar16 + 0x80 + uVar11 * 8) + 8) == this->sub) {
      puVar3 = (undefined8 *)(lVar16 + uVar11 * 0x10);
      local_138._0_8_ = *puVar3;
      local_138._8_8_ = puVar3[1];
      local_128 = *(anon_union_8_2_f12d5f64_for_typeOrLink *)(lVar16 + 0x80 + uVar11 * 8);
      SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
      ::
      emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                ((SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                  *)&local_190,
                 (pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *)
                 local_138);
    }
    IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::operator++
              ((const_iterator *)(local_118 + 0x28));
  }
  if (local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement)
  {
    operator_delete(local_e8.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
  }
  if (local_188 != 0) {
    pSVar9 = &local_190->super_Symbol;
    lVar16 = local_188 * 6;
    pVVar13 = local_190;
    do {
      ValueSymbol::addDriver
                (this_00,Procedural,*(DriverBitRange *)&pVVar13->super_Symbol,
                 *(Expression **)(pVVar13->super_Symbol).name._M_str,this->procedure,this->callExpr)
      ;
      pVVar13 = (ValueSymbol *)&(pVVar13->super_Symbol).location;
    } while (pVVar13 != (ValueSymbol *)(&pSVar9->kind + lVar16));
  }
  if ((ValueDriver *)local_b0._72_8_ != (ValueDriver *)(local_b0 + 0x60)) {
    operator_delete((void *)local_b0._72_8_);
  }
  if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x20) {
    operator_delete((void *)local_b0._8_8_);
  }
  if (local_190 != (ValueSymbol *)&stack0xfffffffffffffe88) {
    operator_delete(local_190);
  }
  return;
}

Assistant:

void handle(const ValueExpressionBase& expr) {
        auto& sym = expr.symbol;
        if (!visitedValues.emplace(&sym).second)
            return;

        if (sub.getCompilation().hasFlag(CompilationFlags::AllowMultiDrivenLocals)) {
            auto scope = sym.getParentScope();
            while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
                scope = scope->asSymbol().getParentScope();

            if (scope == &sub) {
                // This is a local variable of the subroutine,
                // so don't do driver checking.
                return;
            }
        }

        // If the target symbol is driven by the subroutine we're inspecting,
        // add another driver for the procedure we're originally called from.
        SmallVector<std::pair<DriverBitRange, const ValueDriver*>> drivers;
        auto range = sym.drivers();
        for (auto it = range.begin(); it != range.end(); ++it) {
            if ((*it)->containingSymbol == &sub)
                drivers.push_back({it.bounds(), *it});
        }

        // This needs to be a separate loop to avoid mutating the driver map
        // while iterating over it.
        for (auto [bounds, driver] : drivers) {
            sym.addDriver(DriverKind::Procedural, bounds, *driver->prefixExpression, procedure,
                          callExpr);
        }
    }